

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>,_bool>
* __thiscall
absl::lts_20250127::container_internal::
btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
::lower_bound_equal<int>
          (pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>,_bool>
           *__return_storage_ptr__,
          btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          *this,int *key)

{
  undefined1 auVar1 [12];
  bool bVar2;
  SearchResult<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>,_false>
  SVar3;
  const_iterator cVar4;
  iterator lower;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  local_30;
  
  SVar3 = internal_lower_bound<int>(this,key);
  auVar1 = SVar3.value._0_12_;
  if (SVar3.value.node_ ==
      (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
       *)0x0) {
    cVar4 = end(this);
    auVar1 = cVar4._0_12_;
  }
  local_30.node_ = auVar1._0_8_;
  local_30.position_ = auVar1._8_4_;
  cVar4 = end(this);
  bVar2 = btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
          ::Equals(&local_30,cVar4);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    if (((ulong)local_30.node_ & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                    ,0x1fe,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned int, unsigned char, int, absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 61, 62>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned int, unsigned char, int, absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 61, 62>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 3UL, Char = const char]"
                   );
    }
    bVar2 = *(int *)(local_30.node_ + (long)local_30.position_ * 4 + 0xc) <= *key;
  }
  (__return_storage_ptr__->first).node_ = local_30.node_;
  *(ulong *)&(__return_storage_ptr__->first).position_ =
       CONCAT44(local_30._12_4_,local_30.position_);
  __return_storage_ptr__->second = bVar2;
  return __return_storage_ptr__;
}

Assistant:

auto btree<P>::lower_bound_equal(const K &key) const
    -> std::pair<iterator, bool> {
  const SearchResult<iterator, is_key_compare_to::value> res =
      internal_lower_bound(key);
  const iterator lower = iterator(internal_end(res.value));
  const bool equal = res.HasMatch()
                         ? res.IsEq()
                         : lower != end() && !compare_keys(key, lower.key());
  return {lower, equal};
}